

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TArray<FString,_FString>::Delete(TArray<FString,_FString> *this,uint index,int deletecount)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar3 = this->Count - index;
  if (deletecount + index <= this->Count) {
    uVar3 = deletecount;
  }
  if (0 < (int)uVar3) {
    uVar2 = 0;
    do {
      FString::~FString(this->Array + (index + (int)uVar2));
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar3);
    uVar1 = this->Count - uVar3;
    this->Count = uVar1;
    if (index < uVar1) {
      memmove(this->Array + index,this->Array + (uVar3 + index),(ulong)(uVar1 - index) << 3);
      return;
    }
  }
  return;
}

Assistant:

void Delete (unsigned int index, int deletecount)
	{
		if (index + deletecount > Count)
		{
			deletecount = Count - index;
		}
		if (deletecount > 0)
		{
			for (int i = 0; i < deletecount; i++)
			{
				Array[index + i].~T();
			}
			Count -= deletecount;
			if (index < Count)
			{
				memmove (&Array[index], &Array[index+deletecount], sizeof(T)*(Count - index));
			}
		}
	}